

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::objectivec::ImportWriter::ProtoFrameworkCollector::ConsumeLine
          (ProtoFrameworkCollector *this,StringPiece *line,string *out_error)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  char *pcVar2;
  stringpiece_ssize_type sVar3;
  iterator iVar4;
  ostream *poVar5;
  size_type sVar6;
  mapped_type *this_02;
  undefined8 *puVar7;
  long *plVar8;
  size_type *psVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  StringPiece proto_file;
  StringPiece proto_file_list;
  StringPiece framework_name;
  key_type local_d0;
  key_type local_b0;
  StringPiece local_90;
  StringPiece local_80;
  char local_70;
  undefined7 uStack_6f;
  size_type local_60;
  StringPiece local_58;
  ulong local_48 [2];
  size_type local_38;
  
  local_80.length_ = (stringpiece_ssize_type)local_80.ptr_;
  local_58.length_ = (stringpiece_ssize_type)local_58.ptr_;
  sVar3 = StringPiece::find(line,':',0);
  local_38 = (size_type)(int)sVar3;
  if (local_38 != 0xffffffffffffffff) {
    iVar13 = 0;
    local_58 = StringPiece::substr(line,0,local_38);
    local_60 = 0xffffffffffffffff;
    local_80 = StringPiece::substr(line,(sVar3 << 0x20) + 0x100000000 >> 0x20,0xffffffffffffffff);
    lVar10 = local_80.length_;
    TrimWhitespace(&local_58);
    if (0 < lVar10) {
      sVar6 = 0;
      do {
        sVar3 = StringPiece::find(&local_80,',',sVar6);
        iVar12 = (int)sVar3;
        if ((long)(int)sVar3 == local_60) {
          iVar12 = (int)local_80.length_;
        }
        local_90 = StringPiece::substr(&local_80,sVar6,(long)(iVar12 - iVar13));
        TrimWhitespace(&local_90);
        if (local_90.length_ != 0) {
          this_00 = &this->map_->_M_t;
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          if (local_90.ptr_ == (char *)0x0) {
            local_d0._M_string_length = 0;
            local_d0.field_2._M_allocated_capacity =
                 local_d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
          }
          else {
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_d0,local_90.ptr_,local_90.ptr_ + local_90.length_);
          }
          iVar4 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::find(this_00,&local_d0);
          paVar1 = &local_b0.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          if ((_Rb_tree_header *)iVar4._M_node != &(this->map_->_M_t)._M_impl.super__Rb_tree_header)
          {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "warning: duplicate proto file reference, replacing framework entry for \'",
                       0x48);
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            if (local_90.ptr_ == (char *)0x0) {
              local_d0._M_string_length = 0;
              local_d0.field_2._M_allocated_capacity =
                   local_d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
            }
            else {
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_d0,local_90.ptr_,local_90.ptr_ + local_90.length_);
            }
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,local_d0._M_dataplus._M_p,
                                local_d0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\' with \'",8);
            if (local_58.ptr_ == (char *)0x0) {
              local_b0._M_string_length = 0;
              local_b0.field_2._M_allocated_capacity =
                   local_b0.field_2._M_allocated_capacity & 0xffffffffffffff00;
              local_b0._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_b0._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_b0,local_58.ptr_,local_58.ptr_ + local_58.length_);
            }
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,local_b0._M_dataplus._M_p,local_b0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\' (was \'",8);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,*(char **)(iVar4._M_node + 2),
                                (long)iVar4._M_node[2]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\').",3);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != paVar1) {
              operator_delete(local_b0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p);
            }
            std::ostream::flush();
          }
          sVar6 = StringPiece::find(&local_90,' ',0);
          if (sVar6 != local_60) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "note: framework mapping file had a proto file with a space in, hopefully that isn\'t a missing comma: \'"
                       ,0x66);
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            if (local_90.ptr_ == (char *)0x0) {
              local_d0._M_string_length = 0;
              local_d0.field_2._M_allocated_capacity =
                   local_d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
            }
            else {
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_d0,local_90.ptr_,local_90.ptr_ + local_90.length_);
            }
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,local_d0._M_dataplus._M_p,
                                local_d0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'",1);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p);
            }
            std::ostream::flush();
          }
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          if (local_58.ptr_ == (char *)0x0) {
            local_d0._M_string_length = 0;
            local_d0.field_2._M_allocated_capacity =
                 local_d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
          }
          else {
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_d0,local_58.ptr_,local_58.ptr_ + local_58.length_);
          }
          this_01 = this->map_;
          if (local_90.ptr_ == (char *)0x0) {
            local_b0._M_string_length = 0;
            local_b0.field_2._M_allocated_capacity =
                 local_b0.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_b0._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_b0._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_b0,local_90.ptr_,local_90.ptr_ + local_90.length_);
          }
          this_02 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](this_01,&local_b0);
          std::__cxx11::string::operator=((string *)this_02,(string *)&local_d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != paVar1) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
        }
        iVar13 = iVar12 + 1;
        sVar6 = (size_type)iVar13;
      } while ((long)sVar6 < local_80.length_);
    }
    goto LAB_00264f8f;
  }
  local_58.ptr_ = (char *)local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"Framework/proto file mapping line without colon sign: \'","");
  pcVar2 = line->ptr_;
  if (pcVar2 == (char *)0x0) {
    local_80.length_ = 0;
    local_80.ptr_ = &local_70;
    local_70 = '\0';
  }
  else {
    local_80.ptr_ = &local_70;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,pcVar2,pcVar2 + line->length_);
  }
  uVar11 = 0xf;
  if ((ulong *)local_58.ptr_ != local_48) {
    uVar11 = local_48[0];
  }
  if (uVar11 < (ulong)(local_80.length_ + local_58.length_)) {
    uVar11 = 0xf;
    if (local_80.ptr_ != &local_70) {
      uVar11 = CONCAT71(uStack_6f,local_70);
    }
    if (uVar11 < (ulong)(local_80.length_ + local_58.length_)) goto LAB_00264e74;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_58.ptr_);
  }
  else {
LAB_00264e74:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_80.ptr_);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  psVar9 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_b0.field_2._M_allocated_capacity = *psVar9;
    local_b0.field_2._8_8_ = puVar7[3];
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar9;
    local_b0._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_b0._M_string_length = puVar7[1];
  *puVar7 = psVar9;
  puVar7[1] = 0;
  *(undefined1 *)psVar9 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_b0);
  psVar9 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_d0.field_2._M_allocated_capacity = *psVar9;
    local_d0.field_2._8_8_ = plVar8[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar9;
    local_d0._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_d0._M_string_length = plVar8[1];
  *plVar8 = (long)psVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::string::operator=((string *)out_error,(string *)&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if (local_80.ptr_ != &local_70) {
    operator_delete(local_80.ptr_);
  }
  local_60 = 0xffffffffffffffff;
  if ((ulong *)local_58.ptr_ != local_48) {
    operator_delete(local_58.ptr_);
  }
LAB_00264f8f:
  return local_38 != local_60;
}

Assistant:

bool ImportWriter::ProtoFrameworkCollector::ConsumeLine(
    const StringPiece& line, string* out_error) {
  int offset = line.find(':');
  if (offset == StringPiece::npos) {
    *out_error =
        string("Framework/proto file mapping line without colon sign: '") +
        string(line) + "'.";
    return false;
  }
  StringPiece framework_name = line.substr(0, offset);
  StringPiece proto_file_list = line.substr(offset + 1);
  TrimWhitespace(&framework_name);

  int start = 0;
  while (start < proto_file_list.length()) {
    offset = proto_file_list.find(',', start);
    if (offset == StringPiece::npos) {
      offset = proto_file_list.length();
    }

    StringPiece proto_file = proto_file_list.substr(start, offset - start);
    TrimWhitespace(&proto_file);
    if (proto_file.size() != 0) {
      std::map<string, string>::iterator existing_entry =
          map_->find(string(proto_file));
      if (existing_entry != map_->end()) {
        std::cerr << "warning: duplicate proto file reference, replacing "
                     "framework entry for '"
                  << string(proto_file) << "' with '" << string(framework_name)
                  << "' (was '" << existing_entry->second << "')." << std::endl;
        std::cerr.flush();
      }

      if (proto_file.find(' ') != StringPiece::npos) {
        std::cerr << "note: framework mapping file had a proto file with a "
                     "space in, hopefully that isn't a missing comma: '"
                  << string(proto_file) << "'" << std::endl;
        std::cerr.flush();
      }

      (*map_)[string(proto_file)] = string(framework_name);
    }

    start = offset + 1;
  }

  return true;
}